

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O3

UObject * __thiscall
icu_63::ICUCollatorFactory::create
          (ICUCollatorFactory *this,ICUServiceKey *key,ICUService *param_2,UErrorCode *status)

{
  int iVar1;
  UObject *pUVar2;
  LocaleKey *lkey;
  Locale loc;
  Locale LStack_f8;
  
  iVar1 = (*(this->super_ICUResourceBundleFactory).super_LocaleKeyFactory.super_ICUServiceFactory.
            super_UObject._vptr_UObject[6])(this,key,status);
  if ((char)iVar1 == '\0') {
    pUVar2 = (UObject *)0x0;
  }
  else {
    Locale::Locale(&LStack_f8);
    (*(key->super_UObject)._vptr_UObject[0xb])(key,&LStack_f8);
    pUVar2 = &Collator::makeInstance(&LStack_f8,status)->super_UObject;
    Locale::~Locale(&LStack_f8);
  }
  return pUVar2;
}

Assistant:

UObject*
ICUCollatorFactory::create(const ICUServiceKey& key, const ICUService* /* service */, UErrorCode& status) const {
    if (handlesKey(key, status)) {
        const LocaleKey& lkey = (const LocaleKey&)key;
        Locale loc;
        // make sure the requested locale is correct
        // default LocaleFactory uses currentLocale since that's the one vetted by handlesKey
        // but for ICU rb resources we use the actual one since it will fallback again
        lkey.canonicalLocale(loc);
        
        return Collator::makeInstance(loc, status);
    }
    return NULL;
}